

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool __thiscall ImGuiTextFilter::Draw(ImGuiTextFilter *this,char *label,float width)

{
  bool bVar1;
  ImVec2 local_28;
  
  if ((width != 0.0) || (NAN(width))) {
    ImGui::PushItemWidth(width);
    local_28.x = 0.0;
    local_28.y = 0.0;
    bVar1 = ImGui::InputTextEx(label,this->InputBuf,0x100,&local_28,0,(ImGuiTextEditCallback)0x0,
                               (void *)0x0);
    ImGui::PopItemWidth();
  }
  else {
    local_28.x = 0.0;
    local_28.y = 0.0;
    bVar1 = ImGui::InputTextEx(label,this->InputBuf,0x100,&local_28,0,(ImGuiTextEditCallback)0x0,
                               (void *)0x0);
  }
  if (bVar1) {
    Build(this);
  }
  return bVar1;
}

Assistant:

bool ImGuiTextFilter::Draw(const char* label, float width)
{
    if (width != 0.0f)
        ImGui::PushItemWidth(width);
    bool value_changed = ImGui::InputText(label, InputBuf, IM_ARRAYSIZE(InputBuf));
    if (width != 0.0f)
        ImGui::PopItemWidth();
    if (value_changed)
        Build();
    return value_changed;
}